

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepFrameBuffer.cpp
# Opt level: O0

void __thiscall Imf_3_3::DeepFrameBuffer::insertSampleCountSlice(DeepFrameBuffer *this,Slice *slice)

{
  ArgExc *this_00;
  int *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  if (*in_RSI != 0) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(this_00,in_stack_ffffffffffffffc8);
    __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  memcpy((void *)(in_RDI + 0x30),in_RSI,0x32);
  return;
}

Assistant:

void
DeepFrameBuffer::insertSampleCountSlice (const Slice& slice)
{
    if (slice.type != UINT)
    {
        throw IEX_NAMESPACE::ArgExc (
            "The type of sample count slice should be UINT.");
    }

    _sampleCounts = slice;
}